

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

void Abc_NodeConstantInput(Abc_Obj_t *pNode,Abc_Obj_t *pFanin,int fConst0)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  DdManager *dd;
  DdNode *f;
  ulong uVar3;
  char *pcVar4;
  DdNode *pDVar5;
  ulong uVar6;
  
  pAVar2 = pNode->pNtk;
  if ((pAVar2->ntkFunc == ABC_FUNC_BDD) && (pAVar2->ntkType == ABC_NTK_LOGIC)) {
    dd = (DdManager *)pAVar2->pManFunc;
    uVar1 = (pNode->vFanins).nSize;
    uVar3 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar3;
    }
    while( true ) {
      if (uVar6 == uVar3) {
        pcVar4 = Abc_ObjName(pFanin);
        printf("Node %s should be among",pcVar4);
        pcVar4 = Abc_ObjName(pNode);
        printf(" the fanins of node %s...\n",pcVar4);
        return;
      }
      if ((pNode->vFanins).pArray[uVar3] == pFanin->Id) break;
      uVar3 = uVar3 + 1;
    }
    pDVar5 = Cudd_bddIthVar(dd,(int)uVar3);
    f = (DdNode *)(pNode->field_5).pData;
    pDVar5 = Cudd_Cofactor(dd,f,(DdNode *)((long)fConst0 ^ (ulong)pDVar5));
    (pNode->field_5).pData = pDVar5;
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,f);
    return;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                ,0x247,"void Abc_NodeConstantInput(Abc_Obj_t *, Abc_Obj_t *, int)");
}

Assistant:

void Abc_NodeConstantInput( Abc_Obj_t * pNode, Abc_Obj_t * pFanin, int fConst0 )
{
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bVar, * bTemp;
    int iFanin;
    assert( Abc_NtkIsBddLogic(pNode->pNtk) ); 
    if ( (iFanin = Vec_IntFind( &pNode->vFanins, pFanin->Id )) == -1 )
    {
        printf( "Node %s should be among", Abc_ObjName(pFanin) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNode) );
        return;
    }
    bVar = Cudd_NotCond( Cudd_bddIthVar(dd, iFanin), fConst0 );
    pNode->pData = Cudd_Cofactor( dd, bTemp = (DdNode *)pNode->pData, bVar );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( dd, bTemp );
}